

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  appender out_00;
  appender out_01;
  appender aVar1;
  long in_RCX;
  long in_RSI;
  buffer<char> *in_RDI;
  size_t in_R8;
  uint size;
  bool upper_1;
  bool upper;
  memory_buffer buffer;
  int num_digits;
  buffer<char> *in_stack_fffffffffffffc88;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined8 in_stack_fffffffffffffcb8;
  int num_digits_00;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  undefined8 in_stack_fffffffffffffce8;
  unsigned_long in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  anon_class_24_3_e2c60416 *f;
  undefined1 local_251 [541];
  int local_34;
  size_t local_30;
  long local_28;
  uint local_1c;
  long local_18;
  appender local_10;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_8;
  
  local_34 = 0;
  f = (anon_class_24_3_e2c60416 *)local_251;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)in_RDI;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             in_stack_fffffffffffffc90.container,(allocator<char> *)in_stack_fffffffffffffc88);
  std::allocator<char>::~allocator((allocator<char> *)local_251);
  switch(*(undefined1 *)(local_28 + 8)) {
  case 0:
  case 1:
    local_34 = count_digits(0x29d865);
    num_digits_00 = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffc90.container,in_stack_fffffffffffffc88);
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
         in_stack_fffffffffffffcd4;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
         in_stack_fffffffffffffcd0;
    format_decimal<char,_unsigned_long,_fmt::v10::appender,_0>
              (out_00,(unsigned_long)in_stack_fffffffffffffcc8.container,in_stack_fffffffffffffcc4);
    break;
  case 2:
    in_stack_fffffffffffffcc4 =
         count_digits<3,unsigned_long>((unsigned_long)in_stack_fffffffffffffc90.container);
    local_34 = in_stack_fffffffffffffcc4;
    if ((((*(ushort *)(local_28 + 9) >> 7 & 1) != 0) &&
        (*(int *)(local_28 + 4) <= in_stack_fffffffffffffcc4)) && (local_18 != 0)) {
      prefix_append(&local_1c,0x30);
    }
    appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffc90.container,in_stack_fffffffffffffc88);
    aVar1 = format_uint<3u,char,fmt::v10::appender,unsigned_long>
                      ((appender)in_stack_fffffffffffffcc8.container,
                       CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                       (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                       SUB81((ulong)in_stack_fffffffffffffcb8 >> 0x18,0));
    num_digits_00 =
         aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_;
    break;
  case 3:
  case 4:
    if ((*(ushort *)(local_28 + 9) >> 7 & 1) != 0) {
      prefix_append(&local_1c,((byte)~(*(char *)(local_28 + 8) == '\x04') & 1) << 0xd | 0x5830);
    }
    local_34 = count_digits<4,unsigned_long>((unsigned_long)in_stack_fffffffffffffc90.container);
    appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffc90.container,in_stack_fffffffffffffc88);
    format_uint<4u,char,fmt::v10::appender,unsigned_long>
              ((appender)in_stack_fffffffffffffcc8.container,
               CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffcb8 >> 0x18,0));
    num_digits_00 = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    break;
  case 5:
  case 6:
    if ((*(ushort *)(local_28 + 9) >> 7 & 1) != 0) {
      prefix_append(&local_1c,((byte)~(*(char *)(local_28 + 8) == '\x06') & 1) << 0xd | 0x4230);
    }
    num_digits_00 = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    local_34 = count_digits<1,unsigned_long>((unsigned_long)in_stack_fffffffffffffc90.container);
    appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffc90.container,in_stack_fffffffffffffc88);
    out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
         in_stack_fffffffffffffcfc;
    out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
         in_stack_fffffffffffffcf8;
    format_uint<1u,char,fmt::v10::appender,unsigned_long>
              (out_01,in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffce8 >> 0x18,0));
    break;
  default:
    throw_format_error((char *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  case 0xf:
    aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ =
         in_stack_fffffffffffffcac;
    aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ =
         in_stack_fffffffffffffca8;
    local_8.container =
         (buffer<char> *)
         write_char<char,fmt::v10::appender>
                   (aVar1,(char)((uint)in_stack_fffffffffffffca4 >> 0x18),
                    (format_specs<char> *)
                    CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    goto LAB_0029dcb4;
  }
  to_unsigned<int>(0);
  digit_grouping<char>::count_separators
            ((digit_grouping<char> *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             num_digits_00);
  to_unsigned<int>(0);
  in_stack_fffffffffffffc90.container =
       (buffer<char> *)
       write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>(fmt::v10::appender,unsigned_long,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                 (local_10,(format_specs<char> *)(local_251 + 1),local_30,(size_t)&local_1c,f);
  local_8.container = in_stack_fffffffffffffc90.container;
LAB_0029dcb4:
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             in_stack_fffffffffffffc90.container);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_8.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, upper);
    break;
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::oct: {
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(value), specs);
  default:
    throw_format_error("invalid format specifier");
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}